

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.cpp
# Opt level: O3

void pbrt::anon_class_1_0_00000001::__invoke(StatsAccumulator *accum)

{
  long in_FS_OFFSET;
  
  StatsAccumulator::ReportCounter
            (accum,"Texture/Ptex block reads",*(int64_t *)(in_FS_OFFSET + -0x38));
  *(undefined8 *)(in_FS_OFFSET + -0x38) = 0;
  return;
}

Assistant:

void FreeBufferCaches() {
    LOG_VERBOSE("int buffer bytes: %d", intBufferCache->BytesUsed());
    meshIndexBytes += intBufferCache->BytesUsed();
    intBufferCache->Clear();

    LOG_VERBOSE("p bytes: %d", point3BufferCache->BytesUsed());
    meshPositionBytes += point3BufferCache->BytesUsed();
    point3BufferCache->Clear();

    LOG_VERBOSE("n bytes: %d", normal3BufferCache->BytesUsed());
    meshNormalBytes += normal3BufferCache->BytesUsed();
    normal3BufferCache->Clear();

    LOG_VERBOSE("uv bytes: %d", point2BufferCache->BytesUsed());
    meshUVBytes += point2BufferCache->BytesUsed();
    point2BufferCache->Clear();

    LOG_VERBOSE("s bytes: %d", vector3BufferCache->BytesUsed());
    meshTangentBytes += vector3BufferCache->BytesUsed();
    vector3BufferCache->Clear();
}